

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.cpp
# Opt level: O0

string * __thiscall
libtorrent::aux::print_endpoint_abi_cxx11_
          (string *__return_storage_ptr__,aux *this,address *addr,int port)

{
  bool bVar1;
  undefined8 uVar2;
  allocator<char> local_129;
  string local_128;
  string local_108;
  char local_e8 [8];
  char buf [200];
  int port_local;
  address *addr_local;
  
  buf._196_4_ = SUB84(addr,0);
  bVar1 = boost::asio::ip::address::is_v6((address *)this);
  if (bVar1) {
    boost::asio::ip::address::to_string_abi_cxx11_(&local_108,(address *)this);
    uVar2 = ::std::__cxx11::string::c_str();
    snprintf(local_e8,200,"[%s]:%d",uVar2,(ulong)(uint)buf._196_4_);
    ::std::__cxx11::string::~string((string *)&local_108);
  }
  else {
    boost::asio::ip::address::to_string_abi_cxx11_(&local_128,(address *)this);
    uVar2 = ::std::__cxx11::string::c_str();
    snprintf(local_e8,200,"%s:%d",uVar2,(ulong)(uint)buf._196_4_);
    ::std::__cxx11::string::~string((string *)&local_128);
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_e8,&local_129);
  ::std::allocator<char>::~allocator(&local_129);
  return __return_storage_ptr__;
}

Assistant:

std::string print_endpoint(address const& addr, int port)
	{
		char buf[200];
		if (addr.is_v6())
			std::snprintf(buf, sizeof(buf), "[%s]:%d", addr.to_string().c_str(), port);
		else
			std::snprintf(buf, sizeof(buf), "%s:%d", addr.to_string().c_str(), port);
		return buf;
	}